

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::toJSON(CFG *this,string *filename)

{
  pointer pbVar1;
  pointer ppPVar2;
  Production *pPVar3;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar4;
  ostream *poVar5;
  pointer ppPVar6;
  pointer pbVar7;
  Value productionsToRJ;
  Value productionsRJ;
  Value terminalsRJ;
  Value alphabetRJ;
  StringRefType local_3e8;
  StringRefType local_3d8;
  StringRefType local_3c8;
  Value productionRJ;
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  Document document;
  StringRefType local_2d0;
  undefined1 local_2c0 [48];
  StringRefType local_290;
  undefined1 local_280 [40];
  undefined4 local_258;
  undefined1 local_250 [32];
  ofstream myfile;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&document,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  document.
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  .data_.n = (Number)0x0;
  document.
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  .data_.s.str = (Ch *)0x3000000000000;
  allocator = rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::GetAllocator(&document);
  alphabetRJ.data_.n = (Number)0x0;
  alphabetRJ.data_.s.str = (Ch *)0x4000000000000;
  pbVar1 = (this->nonTerminalsV).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->nonTerminalsV).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    std::__cxx11::string::string((string *)&myfile,(string *)pbVar7);
    std::__cxx11::string::string((string *)local_250,(string *)&myfile);
    strJSON((string *)&productionRJ,(AllocatorType *)local_250);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&alphabetRJ,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&productionRJ,allocator);
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)&myfile);
  }
  local_280._32_8_ = "Variables";
  local_258 = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&document.
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(StringRefType *)(local_280 + 0x20),&alphabetRJ,allocator);
  terminalsRJ.data_.n = (Number)0x0;
  terminalsRJ.data_.s.str = (Ch *)0x4000000000000;
  pbVar1 = (this->terminalsT).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->terminalsT).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    std::__cxx11::string::string((string *)&myfile,(string *)pbVar7);
    std::__cxx11::string::string((string *)local_280,(string *)&myfile);
    strJSON((string *)&productionRJ,(AllocatorType *)local_280);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&terminalsRJ,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&productionRJ,allocator);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)&myfile);
  }
  local_290.s = "Terminals";
  local_290.length = 9;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&document.
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_290,&terminalsRJ,allocator);
  productionsRJ.data_.n = (Number)0x0;
  productionsRJ.data_.s.str = (Ch *)0x4000000000000;
  ppPVar2 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar6 = (this->productionsP).
                 super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar6 != ppPVar2; ppPVar6 = ppPVar6 + 1) {
    pPVar3 = *ppPVar6;
    productionRJ.data_.n = (Number)0x0;
    productionRJ.data_.s.str = (Ch *)0x3000000000000;
    local_3c8.s = "head";
    local_3c8.length = 4;
    std::__cxx11::string::string((string *)local_358,(string *)pPVar3);
    strJSON((string *)&myfile,(AllocatorType *)local_358);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&productionRJ,&local_3c8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&myfile,allocator);
    std::__cxx11::string::~string((string *)local_358);
    productionsToRJ.data_.n = (Number)0x0;
    productionsToRJ.data_.s.str = (Ch *)0x4000000000000;
    pbVar1 = (pPVar3->toP).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (pPVar3->toP).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      std::__cxx11::string::string((string *)&myfile,(string *)pbVar7);
      std::__cxx11::string::string((string *)local_2c0,(string *)&myfile);
      strJSON((string *)(local_2c0 + 0x20),(AllocatorType *)local_2c0);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(&productionsToRJ,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)(local_2c0 + 0x20),allocator);
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::string::~string((string *)&myfile);
    }
    local_3d8.s = "body";
    local_3d8.length = 4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&productionRJ,&local_3d8,&productionsToRJ,allocator);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&productionsRJ,&productionRJ,allocator);
  }
  local_2d0.s = "Productions";
  local_2d0.length = 0xb;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&document.
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_2d0,&productionsRJ,allocator);
  local_3e8.s = "Start";
  local_3e8.length = 5;
  std::__cxx11::string::string((string *)local_378,(string *)&this->startS);
  strJSON((string *)&myfile,(AllocatorType *)local_378);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&document.
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_3e8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&myfile,allocator);
  std::__cxx11::string::~string((string *)local_378);
  productionsToRJ.data_.n = (Number)0x0;
  productionsToRJ.data_.s.str = (Ch *)0x0;
  productionRJ.data_.n = (Number)&productionsToRJ;
  productionRJ.data_.s.str = (Ch *)0x0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&document,
             (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)&productionRJ);
  std::ofstream::ofstream(&myfile);
  std::ofstream::open((string *)&myfile,(_Ios_Openmode)filename);
  pCVar4 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &productionsToRJ);
  poVar5 = std::operator<<((ostream *)&myfile,pCVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ofstream::close();
  std::ofstream::~ofstream(&myfile);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack
            ((Stack<rapidjson::CrtAllocator> *)((long)&productionRJ.data_ + 8));
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack
            ((Stack<rapidjson::CrtAllocator> *)&productionsToRJ);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&document);
  return;
}

Assistant:

void CFG::toJSON(std::string filename) {
    // document is the root of a json message
    rapidjson::Document document;

    // define the document as an object rather than an array
    document.SetObject();

    // must pass an allocator when the object may need to allocate memory
    rapidjson::Document::AllocatorType &allocator = document.GetAllocator();

//    document.AddMember("type", "CFG", allocator);

    // create a rapidjson array type with similar syntax to std::vector
    // non-Terminals
    rapidjson::Value alphabetRJ(rapidjson::kArrayType);
    for (std::string character: nonTerminalsV) {
        alphabetRJ.PushBack(strJSON(character, allocator), allocator);
    }
    document.AddMember("Variables", alphabetRJ, allocator);

    // Terminals
    rapidjson::Value terminalsRJ(rapidjson::kArrayType);
    for (std::string character: terminalsT) {
        terminalsRJ.PushBack(strJSON(character, allocator), allocator);
    }
    document.AddMember("Terminals", terminalsRJ, allocator);


//    document.AddMember("eps", strJSON(string(1, epsilon), allocator), allocator);

    rapidjson::Value productionsRJ(rapidjson::kArrayType);
    for (Production *production: productionsP) {

        rapidjson::Value productionRJ(rapidjson::kObjectType);

        productionRJ.AddMember("head", strJSON(production->getFromP(), allocator), allocator);

        rapidjson::Value productionsToRJ(rapidjson::kArrayType);
        for (std::string productionElement: production->getToP()) {
            productionsToRJ.PushBack(strJSON(productionElement, allocator), allocator);
        }
        productionRJ.AddMember("body", productionsToRJ, allocator);
        productionsRJ.PushBack(productionRJ, allocator);
    }
    document.AddMember("Productions", productionsRJ, allocator);

    document.AddMember("Start", strJSON(startS, allocator), allocator);

    rapidjson::StringBuffer strbuf;
    rapidjson::Writer<rapidjson::StringBuffer> writer(strbuf);
    document.Accept(writer);

    // Source: s.n.(2019). Input/output with files. Visited on March 30, 2019 via http://www.cplusplus.com/doc/tutorial/files/
    // Yup, alweer diezelfde bron als altijd, ooit zal ik die 4 lijntjes wel vanbuiten kennen

    std::ofstream myfile;
    myfile.open(filename);

    myfile << strbuf.GetString() << std::endl;

    myfile.close();

}